

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_kmgmt.c
# Opt level: O0

int ecx_export(void *keydata,int selection,OSSL_CALLBACK *param_cb,void *cbarg)

{
  int iVar1;
  ECX_KEY *key_00;
  OSSL_PARAM *params_00;
  undefined8 in_RCX;
  code *in_RDX;
  uint in_ESI;
  long in_RDI;
  int ret;
  OSSL_PARAM *params;
  OSSL_PARAM_BLD *tmpl;
  ECX_KEY *key;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  OSSL_PARAM_BLD *tmpl_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  tmpl_00 = (OSSL_PARAM_BLD *)0x0;
  iVar2 = 0;
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) || (in_RDI == 0)) {
    iVar2 = 0;
  }
  else {
    key_00 = (ECX_KEY *)OSSL_PARAM_BLD_new();
    if (key_00 == (ECX_KEY *)0x0) {
      iVar2 = 0;
    }
    else {
      if ((((in_ESI & 3) == 0) ||
          (iVar1 = key_to_params(key_00,tmpl_00,
                                 (OSSL_PARAM *)CONCAT44(iVar2,in_stack_ffffffffffffffb8)),
          iVar1 != 0)) &&
         (params_00 = OSSL_PARAM_BLD_to_param
                                ((OSSL_PARAM_BLD *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
         params_00 != (OSSL_PARAM *)0x0)) {
        iVar2 = (*in_RDX)(params_00,in_RCX);
        OSSL_PARAM_free(params_00);
      }
      OSSL_PARAM_BLD_free((OSSL_PARAM_BLD *)0x3365f5);
    }
  }
  return iVar2;
}

Assistant:

static int ecx_export(void *keydata, int selection, OSSL_CALLBACK *param_cb,
                      void *cbarg)
{
    ECX_KEY *key = keydata;
    OSSL_PARAM_BLD *tmpl;
    OSSL_PARAM *params = NULL;
    int ret = 0;

    if (!ossl_prov_is_running() || key == NULL)
        return 0;

    tmpl = OSSL_PARAM_BLD_new();
    if (tmpl == NULL)
        return 0;

    if ((selection & OSSL_KEYMGMT_SELECT_KEYPAIR) != 0
         && !key_to_params(key, tmpl, NULL))
        goto err;

    params = OSSL_PARAM_BLD_to_param(tmpl);
    if (params == NULL)
        goto err;

    ret = param_cb(params, cbarg);
    OSSL_PARAM_free(params);
err:
    OSSL_PARAM_BLD_free(tmpl);
    return ret;
}